

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall dxil_spv::SPIRVModule::Impl::Impl(Impl *this,SPIRVModule *module)

{
  SPIRVModule *module_local;
  Impl *this_local;
  
  BlockEmissionInterface::BlockEmissionInterface(&this->super_BlockEmissionInterface);
  (this->super_BlockEmissionInterface)._vptr_BlockEmissionInterface =
       (_func_int **)&PTR__Impl_00339c40;
  this->self = module;
  spv::SpvBuildLogger::SpvBuildLogger(&this->build_logger);
  spv::Builder::Builder(&this->builder,0x7541521e,&this->build_logger);
  this->entry_function = (Function *)0x0;
  this->active_function = (Function *)0x0;
  this->entry_point = (Instruction *)0x0;
  this->discard_function = (Function *)0x0;
  this->discard_function_cond = (Function *)0x0;
  this->demote_function_cond = (Function *)0x0;
  this->discard_state_var_id = 0;
  this->execution_model = ExecutionModelMax;
  {unnamed_type#1}::Impl((_unnamed_type_1_ *)&this->caps);
  std::
  unordered_map<spv::BuiltIn,_unsigned_int,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>_>
  ::unordered_map(&this->builtins_input);
  std::
  unordered_map<unsigned_int,_spv::BuiltIn,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>_>
  ::unordered_map(&this->id_to_builtin_input);
  std::
  unordered_map<spv::BuiltIn,_unsigned_int,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>_>
  ::unordered_map(&this->builtins_output);
  std::
  unordered_map<unsigned_int,_spv::BuiltIn,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>_>
  ::unordered_map(&this->id_to_builtin_output);
  ScratchPool<dxil_spv::Operation>::ScratchPool(&this->operation_pool);
  this->mark_error = false;
  this->descriptor_qa_helper_call_id = 0;
  this->wave_multi_prefix_count_bits_id = 0;
  this->robust_atomic_counter_call_id = 0;
  this->quad_all_call_id = 0;
  this->quad_any_call_id = 0;
  this->wave_is_first_lane_masked_id = 0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&this->wave_match_call_ids);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&this->wave_active_all_equal_masked_ids);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&this->wave_read_first_lane_masked_ids);
  this->image_r64_atomic_call_id = 0;
  this->image_r64_array_atomic_call_id = 0;
  this->image_r64_atomic_non_uniform_call_id = 0;
  this->image_r64_array_atomic_non_uniform_call_id = 0;
  this->finish_cross_group_sharing_call_id = 0;
  this->allocate_thread_node_records_call_id = 0;
  this->allocate_group_node_records_call_id = 0;
  this->increment_thread_node_count_call_id = 0;
  this->increment_group_node_count_call_id = 0;
  this->allocate_thread_node_records_waterfall_call_id = 0;
  this->node_coalesce_payload_offset_call_id = 0;
  this->is_quad_uniform_call_id = 0;
  this->validate_bda_load_store_call_id = 0;
  this->allocate_invocation_id_call_id = 0;
  std::
  vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
  ::vector(&this->wave_multi_prefix_call_ids);
  std::
  vector<dxil_spv::SPIRVModule::Impl::CBVOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CBVOp>_>
  ::vector(&this->physical_cbv_call_ids);
  std::
  vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
  ::vector(&this->coop_mat_conv_ids);
  DescriptorQAInfo::DescriptorQAInfo(&this->descriptor_qa_info);
  this->override_spirv_version = 0;
  this->helper_lanes_participate_in_wave_ops = true;
  InstructionInstrumentationState::InstructionInstrumentationState
            (&this->instruction_instrumentation);
  return;
}

Assistant:

explicit Impl(SPIRVModule &module)
	    : self(module), builder(GENERATOR, &build_logger)
	{
	}